

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

void j2k_destroy_cstr_index(opj_codestream_index_t *p_cstr_ind)

{
  uint local_14;
  OPJ_UINT32 it_tile;
  opj_codestream_index_t *p_cstr_ind_local;
  
  if (p_cstr_ind != (opj_codestream_index_t *)0x0) {
    if (p_cstr_ind->marker != (opj_marker_info_t *)0x0) {
      opj_free(p_cstr_ind->marker);
      p_cstr_ind->marker = (opj_marker_info_t *)0x0;
    }
    if (p_cstr_ind->tile_index != (opj_tile_index_t *)0x0) {
      for (local_14 = 0; local_14 < p_cstr_ind->nb_of_tiles; local_14 = local_14 + 1) {
        if (p_cstr_ind->tile_index[local_14].packet_index != (opj_packet_info_t *)0x0) {
          opj_free(p_cstr_ind->tile_index[local_14].packet_index);
          p_cstr_ind->tile_index[local_14].packet_index = (opj_packet_info_t *)0x0;
        }
        if (p_cstr_ind->tile_index[local_14].tp_index != (opj_tp_index_t *)0x0) {
          opj_free(p_cstr_ind->tile_index[local_14].tp_index);
          p_cstr_ind->tile_index[local_14].tp_index = (opj_tp_index_t *)0x0;
        }
        if (p_cstr_ind->tile_index[local_14].marker != (opj_marker_info_t *)0x0) {
          opj_free(p_cstr_ind->tile_index[local_14].marker);
          p_cstr_ind->tile_index[local_14].marker = (opj_marker_info_t *)0x0;
        }
      }
      opj_free(p_cstr_ind->tile_index);
      p_cstr_ind->tile_index = (opj_tile_index_t *)0x0;
    }
    opj_free(p_cstr_ind);
  }
  return;
}

Assistant:

void j2k_destroy_cstr_index (opj_codestream_index_t *p_cstr_ind)
{
        if (p_cstr_ind) {

                if (p_cstr_ind->marker) {
                        opj_free(p_cstr_ind->marker);
                        p_cstr_ind->marker = NULL;
                }

                if (p_cstr_ind->tile_index) {
                        OPJ_UINT32 it_tile = 0;

                        for (it_tile=0; it_tile < p_cstr_ind->nb_of_tiles; it_tile++) {

                                if(p_cstr_ind->tile_index[it_tile].packet_index) {
                                        opj_free(p_cstr_ind->tile_index[it_tile].packet_index);
                                        p_cstr_ind->tile_index[it_tile].packet_index = NULL;
                                }

                                if(p_cstr_ind->tile_index[it_tile].tp_index){
                                        opj_free(p_cstr_ind->tile_index[it_tile].tp_index);
                                        p_cstr_ind->tile_index[it_tile].tp_index = NULL;
                                }

                                if(p_cstr_ind->tile_index[it_tile].marker){
                                        opj_free(p_cstr_ind->tile_index[it_tile].marker);
                                        p_cstr_ind->tile_index[it_tile].marker = NULL;

                                }
                        }

                        opj_free( p_cstr_ind->tile_index);
                        p_cstr_ind->tile_index = NULL;
                }

                opj_free(p_cstr_ind);
        }
}